

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_protection_flags(textblock *tb,player_shape *s)

{
  _Bool _Var1;
  obj_property *poVar2;
  obj_property *prop;
  wchar_t local_28;
  wchar_t i;
  wchar_t n;
  wchar_t nmax;
  char **msgs;
  player_shape *s_local;
  textblock *tb_local;
  
  _n = (char **)0x0;
  i = L'\0';
  local_28 = L'\0';
  msgs = (char **)s;
  s_local = (player_shape *)tb;
  for (prop._4_4_ = L'\x01'; prop._4_4_ < L'-'; prop._4_4_ = prop._4_4_ + L'\x01') {
    poVar2 = lookup_obj_property(L'\x03',prop._4_4_);
    if ((poVar2->subtype == L'\x02') &&
       (_Var1 = flag_has_dbg((bitflag *)(msgs + 9),6,poVar2->index,"s->flags","prop->index"), _Var1)
       ) {
      shape_lore_helper_append_to_list(poVar2->desc,(char ***)&n,&i,&local_28);
    }
  }
  if (L'\0' < local_28) {
    textblock_append((textblock *)s_local,"Provides protection from");
    shape_lore_append_list((textblock *)s_local,_n,local_28);
    textblock_append((textblock *)s_local,".\n");
    for (prop._4_4_ = L'\0'; prop._4_4_ < local_28; prop._4_4_ = prop._4_4_ + L'\x01') {
      string_free(_n[prop._4_4_]);
    }
  }
  mem_free(_n);
  return;
}

Assistant:

static void shape_lore_append_protection_flags(textblock *tb,
	const struct player_shape *s)
{
	const char **msgs = NULL;
	int nmax = 0, n = 0;
	int i;

	for (i = 1; i < OF_MAX; ++i) {
		struct obj_property *prop =
			lookup_obj_property(OBJ_PROPERTY_FLAG, i);

		if (prop->subtype == OFT_PROT &&
			of_has(s->flags, prop->index)) {
			shape_lore_helper_append_to_list(
				prop->desc, &msgs, &nmax, &n);
		}
	}

	if (n > 0) {
		textblock_append(tb, "Provides protection from");
		shape_lore_append_list(tb, msgs, n);
		textblock_append(tb, ".\n");
		for (i = 0; i < n; ++i) {
			string_free((char*) msgs[i]);
		}
	}

	mem_free(msgs);
}